

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_Interval __thiscall
ON_PlaneEquation::ValueRange
          (ON_PlaneEquation *this,size_t point_index_count,size_t point_index_stride,
          uint *point_index_list,ON_3dPointListRef *point_list)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ON_Interval OVar9;
  double local_b0;
  double local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  local_b0 = ON_Interval::EmptyInterval.m_t[0];
  local_a8 = ON_Interval::EmptyInterval.m_t[1];
  bVar1 = IsValid(this);
  if (((bVar1) && (uVar3 = point_list->m_point_count, uVar3 != 0)) &&
     (uVar5 = (uint)point_index_count,
     uVar5 != 0 && 0xffffffff00000001 < point_index_count - 0xffffffff)) {
    if (point_index_list == (uint *)0x0) {
      if (uVar5 <= uVar3) {
        for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
          ON_3dPointListRef::operator[](&local_78,point_list,uVar3);
          dVar8 = this->z * local_78.z + this->x * local_78.x + this->y * local_78.y + this->d;
          if (ABS(dVar8) < 1.23432101234321e+308) {
            local_a8 = dVar8;
            while (local_b0 = dVar8, uVar3 = uVar3 + 1, uVar3 < uVar5) {
              ON_3dPointListRef::operator[](&local_90,point_list,uVar3);
              dVar7 = this->z * local_90.z + this->x * local_90.x + this->y * local_90.y + this->d;
              dVar8 = local_b0;
              if (((ABS(dVar7) < 1.23432101234321e+308) && (dVar8 = dVar7, local_b0 <= dVar7)) &&
                 (dVar8 = local_b0, local_a8 < dVar7)) {
                local_a8 = dVar7;
              }
            }
            break;
          }
        }
      }
    }
    else {
      iVar4 = (int)point_index_stride;
      if (iVar4 != 0 && point_index_stride - 1 >> 1 < 0x7fffffff) {
        for (uVar2 = 1; uVar2 - 1 < uVar5 * iVar4; uVar2 = uVar2 + iVar4) {
          if (point_index_list[uVar2 - 1] < uVar3) {
            ON_3dPointListRef::operator[](&local_48,point_list,point_index_list[uVar2 - 1]);
            dVar8 = this->z * local_48.z + this->x * local_48.x + this->y * local_48.y + this->d;
            dVar7 = dVar8;
            if (ABS(dVar8) < 1.23432101234321e+308) goto LAB_00589c78;
          }
        }
      }
    }
  }
LAB_00589dcb:
  OVar9.m_t[0] = local_b0;
  OVar9.m_t[1] = local_a8;
  return (ON_Interval)OVar9.m_t;
LAB_00589c78:
  for (; local_b0 = dVar7, local_a8 = dVar8, uVar2 < uVar5 * iVar4; uVar2 = uVar2 + iVar4) {
    dVar7 = local_b0;
    if (point_index_list[uVar2] < uVar3) {
      ON_3dPointListRef::operator[](&local_60,point_list,point_index_list[uVar2]);
      dVar6 = this->z * local_60.z + this->x * local_60.x + this->y * local_60.y + this->d;
      if (((ABS(dVar6) < 1.23432101234321e+308) && (dVar7 = dVar6, local_b0 <= dVar6)) &&
         (dVar7 = local_b0, dVar8 < dVar6)) {
        dVar8 = dVar6;
      }
    }
    local_b0 = dVar7;
    dVar7 = local_b0;
  }
  goto LAB_00589dcb;
}

Assistant:

ON_Interval ON_PlaneEquation::ValueRange(
  size_t point_index_count,
  size_t point_index_stride,
  const unsigned int* point_index_list,
  const class ON_3dPointListRef& point_list
  ) const
{
  ON_Interval value_interval(ON_Interval::EmptyInterval);

  for(;;)
  {
    if ( false == IsValid() )
      break; // invalid plane equation;

    double h;
    const unsigned int vertex_count = point_list.PointCount();
    if ( 0 == vertex_count )
      break;
    const unsigned int point_count = (point_index_count > 0 && point_index_count < (size_t)ON_UNSET_UINT_INDEX)
                                   ? ((unsigned int)point_index_count)
                                   : 0;
    if ( 0 == point_count )
      break;

    if ( 0 != point_index_list )
    {
      const unsigned int point_stride = (point_index_stride > 0 && point_index_stride < (size_t)ON_UNSET_UINT_INDEX)
                                      ? ((unsigned int)point_index_stride)
                                      : 0;
      if ( 0 == point_stride )
        break;
      for ( unsigned int i = 0; i < point_count*point_stride; i += point_stride )
      {
        unsigned int j = point_index_list[i];
        if ( j >= vertex_count )
          continue;
        h = ValueAt(point_list[j]);
        if ( ON_IsValid(h) )
        {
          value_interval.Set(h,h);
          for (i++; i < point_count*point_stride; i+= point_stride )
          {
            unsigned int j_local = point_index_list[i];
            if ( j_local >= vertex_count )
              continue;
            h = ValueAt(point_list[j_local]);
            if ( ON_IsValid(h) )
            {
              if ( h < value_interval.m_t[0] )
                value_interval.m_t[0] = h;
              else if ( h > value_interval.m_t[1] )
                value_interval.m_t[1] = h;
            }
          }
          break;
        }
      }
    }
    else if ( point_count <= vertex_count )
    {
      for ( unsigned int i = 0; i < point_count; i++ )
      {        
        h = ValueAt(point_list[i]);
        if ( ON_IsValid(h) )
        {
          value_interval.Set(h,h);
          for (i++; i < point_count; i++ )
          {
            h = ValueAt(point_list[i]);
            if ( ON_IsValid(h) )
            {
              if ( h < value_interval.m_t[0] )
                value_interval.m_t[0] = h;
              else if ( h > value_interval.m_t[1] )
                value_interval.m_t[1] = h;
            }
          }
          break;
        }
      }
    }

    break;
  }
  return value_interval;
}